

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_2::FileState::Append(FileState *this,Slice *data)

{
  long lVar1;
  ulong uVar2;
  reference ppcVar3;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  size_t offset;
  size_t avail;
  size_t src_len;
  char *src;
  MutexLock lock;
  Slice *in_stack_ffffffffffffff68;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = Slice::data(in_stack_ffffffffffffff68);
  local_40 = Slice::size(in_stack_ffffffffffffff68);
  MutexLock::MutexLock((MutexLock *)in_stack_ffffffffffffff68,(Mutex *)0x18da662);
  while (local_40 != 0) {
    uVar2 = *(ulong *)(in_RSI + 0x70) & 0x1fff;
    if (uVar2 == 0) {
      operator_new__(0x2000);
      std::vector<char_*,_std::allocator<char_*>_>::push_back
                ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff68,
                 (value_type *)0x18da6d9);
      local_48 = 0x2000;
    }
    else {
      local_48 = 0x2000 - uVar2;
    }
    if (local_40 < local_48) {
      local_48 = local_40;
    }
    ppcVar3 = std::vector<char_*,_std::allocator<char_*>_>::back
                        ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff68);
    memcpy(*ppcVar3 + uVar2,local_38,local_48);
    local_40 = local_40 - local_48;
    local_38 = local_38 + local_48;
    *(ulong *)(in_RSI + 0x70) = local_48 + *(long *)(in_RSI + 0x70);
  }
  Status::OK();
  MutexLock::~MutexLock((MutexLock *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Append(const Slice& data) {
    const char* src = data.data();
    size_t src_len = data.size();

    MutexLock lock(&blocks_mutex_);
    while (src_len > 0) {
      size_t avail;
      size_t offset = size_ % kBlockSize;

      if (offset != 0) {
        // There is some room in the last block.
        avail = kBlockSize - offset;
      } else {
        // No room in the last block; push new one.
        blocks_.push_back(new char[kBlockSize]);
        avail = kBlockSize;
      }

      if (avail > src_len) {
        avail = src_len;
      }
      memcpy(blocks_.back() + offset, src, avail);
      src_len -= avail;
      src += avail;
      size_ += avail;
    }

    return Status::OK();
  }